

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer_utils.cc
# Opt level: O1

void draco::SplitPathPrivate(string *full_path,string *out_folder_path,string *out_file_name)

{
  long lVar1;
  long *local_48 [2];
  long local_38 [2];
  
  lVar1 = std::__cxx11::string::find_last_of((char *)full_path,0x1622c0,0xffffffffffffffff);
  if (lVar1 == -1) {
    if (out_folder_path != (string *)0x0) {
      std::__cxx11::string::_M_replace
                ((ulong)out_folder_path,0,(char *)out_folder_path->_M_string_length,0x163597);
    }
    if (out_file_name != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)out_file_name);
      return;
    }
  }
  else {
    if (out_folder_path != (string *)0x0) {
      std::__cxx11::string::substr((ulong)local_48,(ulong)full_path);
      std::__cxx11::string::operator=((string *)out_folder_path,(string *)local_48);
      if (local_48[0] != local_38) {
        operator_delete(local_48[0],local_38[0] + 1);
      }
    }
    if (out_file_name != (string *)0x0) {
      std::__cxx11::string::substr((ulong)local_48,(ulong)full_path);
      std::__cxx11::string::operator=((string *)out_file_name,(string *)local_48);
      if (local_48[0] != local_38) {
        operator_delete(local_48[0],local_38[0] + 1);
      }
    }
  }
  return;
}

Assistant:

void SplitPathPrivate(const std::string &full_path,
                      std::string *out_folder_path,
                      std::string *out_file_name) {
  const auto pos = full_path.find_last_of("/\\");
  if (pos != std::string::npos) {
    if (out_folder_path) {
      *out_folder_path = full_path.substr(0, pos);
    }
    if (out_file_name) {
      *out_file_name = full_path.substr(pos + 1, full_path.length());
    }
  } else {
    if (out_folder_path) {
      *out_folder_path = ".";
    }
    if (out_file_name) {
      *out_file_name = full_path;
    }
  }
}